

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O0

string * __thiscall
pstore::http::sha1::digest_to_base64_abi_cxx11_
          (string *__return_storage_ptr__,sha1 *this,result_type *digest)

{
  const_iterator first;
  const_iterator last;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  result_type *digest_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  first = std::begin<std::array<unsigned_char,20ul>>((array<unsigned_char,_20UL> *)this);
  last = std::end<std::array<unsigned_char,20ul>>((array<unsigned_char,_20UL> *)this);
  out = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
  to_base64<unsigned_char_const*,std::back_insert_iterator<std::__cxx11::string>>(first,last,out);
  return __return_storage_ptr__;
}

Assistant:

std::string sha1::digest_to_base64 (sha1::result_type const & digest) {
            std::string result;
            to_base64 (std::begin (digest), std::end (digest), std::back_inserter (result));
            return result;
        }